

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

Layer * ncnn::Input_layer_creator(void)

{
  Layer *pLVar1;
  Input *in_stack_fffffffffffffff0;
  
  pLVar1 = (Layer *)operator_new(200);
  Input::Input(in_stack_fffffffffffffff0);
  return pLVar1;
}

Assistant:

Input::Input()
{
    one_blob_only = true;
    support_inplace = true;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
    support_image_storage = true;
}